

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

uint __thiscall
glslang::TIntermediate::computeTypeXfbSize
          (TIntermediate *this,TType *type,bool *contains64BitType,bool *contains32BitType,
          bool *contains16BitType)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  TTypeList *pTVar5;
  uint7 uVar7;
  bool *pbVar6;
  int member;
  bool bVar8;
  bool memberContains16BitType;
  bool memberContains32BitType;
  bool memberContains64BitType;
  uint size;
  uint local_f0;
  uint local_ec;
  bool *local_e8;
  bool *local_e0;
  bool *local_d8;
  TIntermediate *local_d0;
  TType elementType;
  
  iVar2 = (*type->_vptr_TType[0x1e])(type);
  if ((char)iVar2 == '\0') {
    iVar2 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar2 == '\0') {
      iVar2 = (*type->_vptr_TType[0x18])(type);
      if ((char)iVar2 == '\0') {
        iVar2 = (*type->_vptr_TType[0x1b])(type);
        if ((char)iVar2 == '\0') {
          iVar2 = (*type->_vptr_TType[0x1c])(type);
          if ((char)iVar2 == '\0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                          ,0x865,
                          "unsigned int glslang::TIntermediate::computeTypeXfbSize(const TType &, bool &, bool &, bool &) const"
                         );
          }
          iVar2 = (*type->_vptr_TType[0xd])(type);
          iVar4 = (*type->_vptr_TType[0xe])(type);
          uVar3 = iVar4 * iVar2;
        }
        else {
          uVar3 = (*type->_vptr_TType[0xc])();
        }
      }
      else {
        uVar3 = 1;
      }
      iVar2 = (*type->_vptr_TType[7])(type);
      if (((iVar2 == 2) || (iVar2 = (*type->_vptr_TType[7])(type), iVar2 == 10)) ||
         (iVar2 = (*type->_vptr_TType[7])(type), iVar2 == 0xb)) {
        *contains64BitType = true;
        size = uVar3 << 3;
      }
      else {
        iVar2 = (*type->_vptr_TType[7])(type);
        if (((iVar2 == 3) || (iVar2 = (*type->_vptr_TType[7])(type), iVar2 == 6)) ||
           (iVar2 = (*type->_vptr_TType[7])(type), iVar2 == 7)) {
          *contains16BitType = true;
          size = uVar3 * 2;
        }
        else {
          iVar2 = (*type->_vptr_TType[7])(type);
          size = uVar3;
          if ((iVar2 != 4) && (iVar2 = (*type->_vptr_TType[7])(type), iVar2 != 5)) {
            *contains32BitType = true;
            size = uVar3 << 2;
          }
        }
      }
    }
    else {
      size = 0;
      local_ec = 0;
      local_f0 = 0;
      bVar8 = false;
      local_e8 = contains64BitType;
      local_e0 = contains32BitType;
      local_d8 = contains16BitType;
      local_d0 = this;
      for (iVar2 = 0; pTVar5 = TType::getStruct(type),
          iVar2 < (int)((ulong)((long)(pTVar5->
                                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                      ).
                                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar5->
                                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ).
                                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
          iVar2 = iVar2 + 1) {
        TType::TType(&elementType,type,iVar2,false);
        memberContains64BitType = false;
        memberContains32BitType = false;
        memberContains16BitType = false;
        uVar3 = computeTypeXfbSize(local_d0,&elementType,&memberContains64BitType,
                                   &memberContains32BitType,&memberContains16BitType);
        uVar7 = (uint7)(uint3)(uVar3 >> 8);
        bVar1 = bVar8;
        if (memberContains64BitType == false) {
          if (memberContains32BitType != false) {
            iVar4 = 4;
            local_f0 = (uint)CONCAT71(uVar7,1);
            goto LAB_00379491;
          }
          iVar4 = 2;
          bVar1 = true;
          if (memberContains16BitType == true) goto LAB_00379491;
        }
        else {
          iVar4 = 8;
          local_ec = (uint)CONCAT71(uVar7,1);
LAB_00379491:
          RoundToPow2<unsigned_int>(&size,iVar4);
          bVar8 = bVar1;
        }
        size = size + uVar3;
      }
      if ((((byte)local_ec | (byte)local_f0) & 1) != 0 || bVar8) {
        iVar2 = (local_f0 & 1) * 2 + 2;
        pbVar6 = local_d8;
        if ((local_f0 & 1) != 0) {
          pbVar6 = local_e0;
        }
        if ((local_ec & 1) != 0) {
          pbVar6 = local_e8;
          iVar2 = 8;
        }
        *pbVar6 = true;
        RoundToPow2<unsigned_int>(&size,iVar2);
      }
    }
  }
  else {
    TType::TType(&elementType,type,0,false);
    iVar2 = (*type->_vptr_TType[0xf])(type);
    uVar3 = computeTypeXfbSize(this,&elementType,contains64BitType,contains16BitType,
                               contains16BitType);
    size = uVar3 * iVar2;
  }
  return size;
}

Assistant:

unsigned int TIntermediate::computeTypeXfbSize(const TType& type, bool& contains64BitType, bool& contains32BitType, bool& contains16BitType) const
{
    // "...if applied to an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8,
    // and the space taken in the buffer will be a multiple of 8.
    // ...within the qualified entity, subsequent components are each
    // assigned, in order, to the next available offset aligned to a multiple of
    // that component's size.  Aggregate types are flattened down to the component
    // level to get this sequence of components."

    if (type.isSizedArray()) {
        // TODO: perf: this can be flattened by using getCumulativeArraySize(), and a deref that discards all arrayness
        // Unsized array use to xfb should be a compile error.
        TType elementType(type, 0);
        return type.getOuterArraySize() * computeTypeXfbSize(elementType, contains64BitType, contains16BitType, contains16BitType);
    }

    if (type.isStruct()) {
        unsigned int size = 0;
        bool structContains64BitType = false;
        bool structContains32BitType = false;
        bool structContains16BitType = false;
        for (int member = 0; member < (int)type.getStruct()->size(); ++member) {
            TType memberType(type, member);
            // "... if applied to
            // an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8,
            // and the space taken in the buffer will be a multiple of 8."
            bool memberContains64BitType = false;
            bool memberContains32BitType = false;
            bool memberContains16BitType = false;
            int memberSize = computeTypeXfbSize(memberType, memberContains64BitType, memberContains32BitType, memberContains16BitType);
            if (memberContains64BitType) {
                structContains64BitType = true;
                RoundToPow2(size, 8);
            } else if (memberContains32BitType) {
                structContains32BitType = true;
                RoundToPow2(size, 4);
            } else if (memberContains16BitType) {
                structContains16BitType = true;
                RoundToPow2(size, 2);
            }
            size += memberSize;
        }

        if (structContains64BitType) {
            contains64BitType = true;
            RoundToPow2(size, 8);
        } else if (structContains32BitType) {
            contains32BitType = true;
            RoundToPow2(size, 4);
        } else if (structContains16BitType) {
            contains16BitType = true;
            RoundToPow2(size, 2);
        }
        return size;
    }

    int numComponents {0};
    if (type.isScalar())
        numComponents = 1;
    else if (type.isVector())
        numComponents = type.getVectorSize();
    else if (type.isMatrix())
        numComponents = type.getMatrixCols() * type.getMatrixRows();
    else {
        assert(0);
        numComponents = 1;
    }

    if (type.getBasicType() == EbtDouble || type.getBasicType() == EbtInt64 || type.getBasicType() == EbtUint64) {
        contains64BitType = true;
        return 8 * numComponents;
    } else if (type.getBasicType() == EbtFloat16 || type.getBasicType() == EbtInt16 || type.getBasicType() == EbtUint16) {
        contains16BitType = true;
        return 2 * numComponents;
    } else if (type.getBasicType() == EbtInt8 || type.getBasicType() == EbtUint8)
        return numComponents;
    else {
        contains32BitType = true;
        return 4 * numComponents;
    }
}